

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O1

bitmask<slang::ast::IntegralFlags> __thiscall slang::ast::Type::getIntegralFlags(Type *this)

{
  undefined1 uVar1;
  bool bVar2;
  underlying_type uVar3;
  Type *pTVar4;
  IntegralType *this_00;
  underlying_type uVar5;
  
  pTVar4 = getCanonicalType(this);
  bVar2 = IntegralType::isKind((pTVar4->super_Symbol).kind);
  if (bVar2) {
    this_00 = (IntegralType *)getCanonicalType(this);
    uVar1 = this_00->isSigned;
    uVar5 = uVar1 + '\x02';
    if (this_00->isFourState == false) {
      uVar5 = uVar1;
    }
    bVar2 = IntegralType::isDeclaredReg(this_00);
    uVar3 = uVar5 + '\x04';
    if (!bVar2) {
      uVar3 = uVar5;
    }
  }
  else {
    uVar3 = '\0';
  }
  return (bitmask<slang::ast::IntegralFlags>)uVar3;
}

Assistant:

bitmask<IntegralFlags> Type::getIntegralFlags() const {
    bitmask<IntegralFlags> flags;
    if (!isIntegral())
        return flags;

    const IntegralType& it = getCanonicalType().as<IntegralType>();
    if (it.isSigned)
        flags |= IntegralFlags::Signed;
    if (it.isFourState)
        flags |= IntegralFlags::FourState;
    if (it.isDeclaredReg())
        flags |= IntegralFlags::Reg;

    return flags;
}